

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void prepare_for_pass(j_compress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long *in_RDI;
  j_compress_ptr unaff_retaddr;
  my_master_ptr master;
  
  lVar2 = in_RDI[0x3e];
  iVar1 = *(int *)(lVar2 + 0x20);
  if (iVar1 == 0) {
    select_scan_parameters(unaff_retaddr);
    per_scan_setup(cinfo);
    if ((int)in_RDI[0x24] == 0) {
      (**(code **)in_RDI[0x43])(in_RDI);
      (**(code **)in_RDI[0x44])(in_RDI);
      (**(code **)in_RDI[0x40])(in_RDI,0);
    }
    (**(code **)in_RDI[0x45])(in_RDI);
    (**(code **)in_RDI[0x46])(in_RDI,(int)in_RDI[0x25]);
    uVar3 = 0;
    if (1 < *(int *)(lVar2 + 0x28)) {
      uVar3 = 3;
    }
    (**(code **)in_RDI[0x41])(in_RDI,uVar3);
    (**(code **)in_RDI[0x3f])(in_RDI,0);
    if ((int)in_RDI[0x25] == 0) {
      *(undefined4 *)(lVar2 + 0x18) = 1;
    }
    else {
      *(undefined4 *)(lVar2 + 0x18) = 0;
    }
  }
  else {
    if (iVar1 == 1) {
      select_scan_parameters(unaff_retaddr);
      per_scan_setup(cinfo);
      if ((*(int *)((long)in_RDI + 0x1cc) != 0) || (*(int *)((long)in_RDI + 0x1d4) == 0)) {
        (**(code **)in_RDI[0x46])(in_RDI,1);
        (**(code **)in_RDI[0x41])(in_RDI,2);
        *(undefined4 *)(lVar2 + 0x18) = 0;
        goto LAB_00272e68;
      }
      *(undefined4 *)(lVar2 + 0x20) = 2;
      *(int *)(lVar2 + 0x24) = *(int *)(lVar2 + 0x24) + 1;
    }
    else if (iVar1 != 2) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x31;
      (**(code **)*in_RDI)(in_RDI);
      goto LAB_00272e68;
    }
    if ((int)in_RDI[0x25] == 0) {
      select_scan_parameters(unaff_retaddr);
      per_scan_setup(cinfo);
    }
    (**(code **)in_RDI[0x46])(in_RDI,0);
    (**(code **)in_RDI[0x41])(in_RDI,2);
    if (*(int *)(lVar2 + 0x2c) == 0) {
      (**(code **)(in_RDI[0x42] + 8))(in_RDI);
    }
    (**(code **)(in_RDI[0x42] + 0x10))(in_RDI);
    *(undefined4 *)(lVar2 + 0x18) = 0;
  }
LAB_00272e68:
  *(uint *)(lVar2 + 0x1c) = (uint)(*(int *)(lVar2 + 0x24) == *(int *)(lVar2 + 0x28) + -1);
  if (in_RDI[2] != 0) {
    *(undefined4 *)(in_RDI[2] + 0x18) = *(undefined4 *)(lVar2 + 0x24);
    *(undefined4 *)(in_RDI[2] + 0x1c) = *(undefined4 *)(lVar2 + 0x28);
  }
  return;
}

Assistant:

METHODDEF(void)
prepare_for_pass (j_compress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;

  switch (master->pass_type) {
  case main_pass:
    /* Initial pass: will collect input data, and do either Huffman
     * optimization or data output for the first scan.
     */
    select_scan_parameters(cinfo);
    per_scan_setup(cinfo);
    if (! cinfo->raw_data_in) {
      (*cinfo->cconvert->start_pass) (cinfo);
      (*cinfo->downsample->start_pass) (cinfo);
      (*cinfo->prep->start_pass) (cinfo, JBUF_PASS_THRU);
    }
    (*cinfo->fdct->start_pass) (cinfo);
    (*cinfo->entropy->start_pass) (cinfo, cinfo->optimize_coding);
    (*cinfo->coef->start_pass) (cinfo,
				(master->total_passes > 1 ?
				 JBUF_SAVE_AND_PASS : JBUF_PASS_THRU));
    (*cinfo->main->start_pass) (cinfo, JBUF_PASS_THRU);
    if (cinfo->optimize_coding) {
      /* No immediate data output; postpone writing frame/scan headers */
      master->pub.call_pass_startup = FALSE;
    } else {
      /* Will write frame/scan headers at first jpeg_write_scanlines call */
      master->pub.call_pass_startup = TRUE;
    }
    break;
#ifdef ENTROPY_OPT_SUPPORTED
  case huff_opt_pass:
    /* Do Huffman optimization for a scan after the first one. */
    select_scan_parameters(cinfo);
    per_scan_setup(cinfo);
    if (cinfo->Ss != 0 || cinfo->Ah == 0) {
      (*cinfo->entropy->start_pass) (cinfo, TRUE);
      (*cinfo->coef->start_pass) (cinfo, JBUF_CRANK_DEST);
      master->pub.call_pass_startup = FALSE;
      break;
    }
    /* Special case: Huffman DC refinement scans need no Huffman table
     * and therefore we can skip the optimization pass for them.
     */
    master->pass_type = output_pass;
    master->pass_number++;
    /*FALLTHROUGH*/
#endif
  case output_pass:
    /* Do a data-output pass. */
    /* We need not repeat per-scan setup if prior optimization pass did it. */
    if (! cinfo->optimize_coding) {
      select_scan_parameters(cinfo);
      per_scan_setup(cinfo);
    }
    (*cinfo->entropy->start_pass) (cinfo, FALSE);
    (*cinfo->coef->start_pass) (cinfo, JBUF_CRANK_DEST);
    /* We emit frame/scan headers now */
    if (master->scan_number == 0)
      (*cinfo->marker->write_frame_header) (cinfo);
    (*cinfo->marker->write_scan_header) (cinfo);
    master->pub.call_pass_startup = FALSE;
    break;
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
  }

  master->pub.is_last_pass = (master->pass_number == master->total_passes-1);

  /* Set up progress monitor's pass info if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->completed_passes = master->pass_number;
    cinfo->progress->total_passes = master->total_passes;
  }
}